

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryReader.h
# Opt level: O0

uint32_t __thiscall BinaryReader::ReadUInt32(BinaryReader *this)

{
  ulong uVar1;
  Error *this_00;
  uint32_t local_14;
  BinaryReader *pBStack_10;
  uint32_t value;
  BinaryReader *this_local;
  
  pBStack_10 = this;
  std::istream::read((char *)this->_in,(long)&local_14);
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) == 0) {
    return local_14;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x28);
  Error::Error(this_00,"I/O Error while reading from file.");
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

uint32_t ReadUInt32( void )
	{
		uint32_t value;

		//static_assert(sizeof(value) == 4, "Invalid size of uint32_t type");

		_in.read((char*)&value, 4);

		if (_in.fail())
			throw Error("I/O Error while reading from file.");

		return value;
	}